

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O1

bool __thiscall wallet::CWallet::IsSpentKey(CWallet *this,CScript *scriptPubKey)

{
  map<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_wallet::CAddressBookData,_std::less<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>,_std::allocator<std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_wallet::CAddressBookData>_>_>
  *this_00;
  _Rb_tree_header *p_Var1;
  _Rb_tree_color _Var2;
  bool bVar3;
  const_iterator cVar4;
  LegacyScriptPubKeyMan *pLVar5;
  pointer pubkey_id;
  long in_FS_OFFSET;
  PKHash pkh_dest;
  ScriptHash sh_wpkh_dest;
  WitnessV0KeyHash wpkh_dest;
  CTxDestination dest;
  vector<CKeyID,_std::allocator<CKeyID>_> local_148;
  direct_or_indirect local_130;
  uint local_114;
  void *local_10c;
  uchar auStack_104 [8];
  uchar local_fc [4];
  _Variadic_union<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  local_f8;
  undefined1 local_b0;
  void *local_a8;
  undefined8 uStack_a0;
  undefined4 local_98;
  _Variadic_union<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  local_88;
  undefined1 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_88._16_8_ = 0;
  local_88._24_8_ = 0;
  local_88._0_8_ = 0;
  local_88._8_8_ = 0;
  local_40 = 0;
  bVar3 = ExtractDestination(scriptPubKey,(CTxDestination *)&local_88._M_first);
  if (bVar3) {
    this_00 = &this->m_address_book;
    cVar4 = std::
            _Rb_tree<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_wallet::CAddressBookData>,_std::_Select1st<std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_wallet::CAddressBookData>_>,_std::less<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>,_std::allocator<std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_wallet::CAddressBookData>_>_>
            ::find(&this_00->_M_t,(key_type *)&local_88._M_first);
    p_Var1 = &(this->m_address_book)._M_t._M_impl.super__Rb_tree_header;
    if (((_Rb_tree_header *)cVar4._M_node != p_Var1) &&
       (bVar3 = true, (char)cVar4._M_node[5]._M_color != _S_red)) goto LAB_0015e35b;
    pLVar5 = GetLegacyScriptPubKeyMan(this);
    if (pLVar5 != (LegacyScriptPubKeyMan *)0x0) {
      GetAffectedKeys(&local_148,scriptPubKey,
                      &(pLVar5->super_LegacyDataSPKM).super_FillableSigningProvider.
                       super_SigningProvider);
      if (local_148.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
          super__Vector_impl_data._M_start !=
          local_148.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        pubkey_id = local_148.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
                    super__Vector_impl_data._M_start;
        do {
          local_f8._16_4_ =
               *(undefined4 *)
                ((pubkey_id->super_uint160).super_base_blob<160U>.m_data._M_elems + 0x10);
          local_f8._0_8_ =
               *(undefined8 *)(pubkey_id->super_uint160).super_base_blob<160U>.m_data._M_elems;
          local_f8._8_8_ =
               *(undefined8 *)((pubkey_id->super_uint160).super_base_blob<160U>.m_data._M_elems + 8)
          ;
          local_b0 = 5;
          local_a8 = (void *)local_f8._0_8_;
          uStack_a0 = local_f8._8_8_;
          local_98 = local_f8._16_4_;
          cVar4 = std::
                  _Rb_tree<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_wallet::CAddressBookData>,_std::_Select1st<std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_wallet::CAddressBookData>_>,_std::less<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>,_std::allocator<std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_wallet::CAddressBookData>_>_>
                  ::find(&this_00->_M_t,(key_type *)&local_f8._M_first);
          if ((_Rb_tree_header *)cVar4._M_node != p_Var1) {
            _Var2 = cVar4._M_node[5]._M_color;
            std::__detail::__variant::
            _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
            ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                                 *)&local_f8._M_first);
            if ((char)_Var2 == _S_red) goto LAB_0015e23b;
LAB_0015e393:
            if (local_148.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
                super__Vector_impl_data._M_start != (CKeyID *)0x0) {
              operator_delete(local_148.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
                              super__Vector_impl_data._M_start,
                              (long)local_148.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_148.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
            }
            bVar3 = true;
            goto LAB_0015e35b;
          }
          std::__detail::__variant::
          _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
          ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                               *)&local_f8._M_first);
LAB_0015e23b:
          local_f8._16_4_ = local_98;
          local_f8._0_8_ = local_a8;
          local_f8._8_8_ = uStack_a0;
          local_b0 = 5;
          GetScriptForDestination
                    ((CScript *)&local_130.indirect_contents,(CTxDestination *)&local_f8._M_first);
          ScriptHash::ScriptHash((ScriptHash *)&local_10c,(CScript *)&local_130.indirect_contents);
          if (0x1c < local_114) {
            free(local_130.indirect_contents.indirect);
            local_130.indirect_contents.indirect = (char *)0x0;
          }
          std::__detail::__variant::
          _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
          ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                               *)&local_f8._M_first);
          local_f8._M_first._M_storage._M_storage[0x10] = local_fc[0];
          local_f8._M_first._M_storage._M_storage[0x11] = local_fc[1];
          local_f8._M_first._M_storage._M_storage[0x12] = local_fc[2];
          local_f8._M_first._M_storage._M_storage[0x13] = local_fc[3];
          local_f8._0_8_ = local_10c;
          local_f8._M_first._M_storage._M_storage[8] = auStack_104[0];
          local_f8._M_first._M_storage._M_storage[9] = auStack_104[1];
          local_f8._M_first._M_storage._M_storage[10] = auStack_104[2];
          local_f8._M_first._M_storage._M_storage[0xb] = auStack_104[3];
          local_f8._M_first._M_storage._M_storage[0xc] = auStack_104[4];
          local_f8._M_first._M_storage._M_storage[0xd] = auStack_104[5];
          local_f8._M_first._M_storage._M_storage[0xe] = auStack_104[6];
          local_f8._M_first._M_storage._M_storage[0xf] = auStack_104[7];
          local_b0 = 3;
          cVar4 = std::
                  _Rb_tree<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_wallet::CAddressBookData>,_std::_Select1st<std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_wallet::CAddressBookData>_>,_std::less<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>,_std::allocator<std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_wallet::CAddressBookData>_>_>
                  ::find(&this_00->_M_t,(key_type *)&local_f8._M_first);
          if ((_Rb_tree_header *)cVar4._M_node == p_Var1) {
            std::__detail::__variant::
            _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
            ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                                 *)&local_f8._M_first);
          }
          else {
            _Var2 = cVar4._M_node[5]._M_color;
            std::__detail::__variant::
            _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
            ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                                 *)&local_f8._M_first);
            if ((char)_Var2 != _S_red) goto LAB_0015e393;
          }
          PKHash::PKHash((PKHash *)&local_130.indirect_contents,pubkey_id);
          local_f8._16_4_ = local_130._16_4_;
          local_f8._0_8_ = local_130.indirect_contents.indirect;
          local_f8._8_8_ = local_130._8_8_;
          local_b0 = 2;
          cVar4 = std::
                  _Rb_tree<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_wallet::CAddressBookData>,_std::_Select1st<std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_wallet::CAddressBookData>_>,_std::less<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>,_std::allocator<std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_wallet::CAddressBookData>_>_>
                  ::find(&this_00->_M_t,(key_type *)&local_f8._M_first);
          if ((_Rb_tree_header *)cVar4._M_node == p_Var1) {
            std::__detail::__variant::
            _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
            ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                                 *)&local_f8._M_first);
          }
          else {
            _Var2 = cVar4._M_node[5]._M_color;
            std::__detail::__variant::
            _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
            ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                                 *)&local_f8._M_first);
            if ((char)_Var2 != _S_red) goto LAB_0015e393;
          }
          pubkey_id = pubkey_id + 1;
        } while (pubkey_id !=
                 local_148.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
                 super__Vector_impl_data._M_finish);
      }
      if (local_148.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
          super__Vector_impl_data._M_start != (CKeyID *)0x0) {
        operator_delete(local_148.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_148.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_148.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
    }
  }
  bVar3 = false;
LAB_0015e35b:
  std::__detail::__variant::
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)&local_88._M_first);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar3;
}

Assistant:

bool CWallet::IsSpentKey(const CScript& scriptPubKey) const
{
    AssertLockHeld(cs_wallet);
    CTxDestination dest;
    if (!ExtractDestination(scriptPubKey, dest)) {
        return false;
    }
    if (IsAddressPreviouslySpent(dest)) {
        return true;
    }

    if (LegacyScriptPubKeyMan* spk_man = GetLegacyScriptPubKeyMan()) {
        for (const auto& keyid : GetAffectedKeys(scriptPubKey, *spk_man)) {
            WitnessV0KeyHash wpkh_dest(keyid);
            if (IsAddressPreviouslySpent(wpkh_dest)) {
                return true;
            }
            ScriptHash sh_wpkh_dest(GetScriptForDestination(wpkh_dest));
            if (IsAddressPreviouslySpent(sh_wpkh_dest)) {
                return true;
            }
            PKHash pkh_dest(keyid);
            if (IsAddressPreviouslySpent(pkh_dest)) {
                return true;
            }
        }
    }
    return false;
}